

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 make_ci_list_frm_mdef(char *mdeffile,char ***CIlist,int32 *cilistsize)

{
  uint uVar1;
  int32 iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char **ppcVar6;
  char *__src;
  ulong uVar7;
  acmod_id_t id;
  uint uVar8;
  int iVar9;
  model_def_t *mdef;
  
  iVar2 = model_def_read(&mdef,mdeffile);
  if (iVar2 != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x50,"Unable to read mdef file %s\n",mdeffile);
  }
  uVar1 = mdef->acmod_set->n_ci;
  *cilistsize = uVar1;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = uVar1;
  }
  iVar9 = 0;
  for (id = 0; uVar8 != id; id = id + 1) {
    pcVar4 = acmod_set_id2name(mdef->acmod_set,id);
    sVar5 = strlen(pcVar4);
    iVar3 = (int)sVar5;
    if ((int)sVar5 < iVar9) {
      iVar3 = iVar9;
    }
    iVar9 = iVar3;
  }
  ppcVar6 = (char **)__ckd_calloc_2d__((long)(int)uVar1,(ulong)(iVar9 + 1),1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                       ,0x59);
  *CIlist = ppcVar6;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pcVar4 = ppcVar6[uVar7];
    __src = acmod_set_id2name(mdef->acmod_set,(acmod_id_t)uVar7);
    strcpy(pcVar4,__src);
  }
  return 0;
}

Assistant:

int32 make_ci_list_frm_mdef(const char  *mdeffile,
		            char  ***CIlist, 
                            int32 *cilistsize)
{
    char  **cilist;

    int32 nciphns, id, maxphnsize, phnsize;
    model_def_t *mdef;

    if (model_def_read(&mdef, mdeffile) != S3_SUCCESS) 
	E_ERROR("Unable to read mdef file %s\n",mdeffile);
    *cilistsize = nciphns = mdef->acmod_set->n_ci;

   /* Find phone length */
    maxphnsize = 0;
    for (id = 0; id < nciphns; id++){
	phnsize = strlen(acmod_set_id2name(mdef->acmod_set,id));
 	if (phnsize > maxphnsize) maxphnsize = phnsize;
    }
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (id = 0; id < nciphns; id++){
        strcpy(cilist[id],acmod_set_id2name(mdef->acmod_set,id));
    }

    return S3_SUCCESS;
}